

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrigraph.cpp
# Opt level: O3

void __thiscall TPZGraphElT::NextIJ(TPZGraphElT *this,int no,TPZVec<int> *co,int incr)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  switch(no) {
  case 3:
    *co->fStore = *co->fStore + incr;
    return;
  case 4:
    piVar2 = co->fStore;
    *piVar2 = *piVar2 + incr;
    piVar2[1] = piVar2[1] - incr;
    return;
  case 5:
    co->fStore[1] = co->fStore[1] + incr;
    return;
  case 6:
    iVar3 = ((this->super_TPZGraphEl).fGraphMesh)->fResolution;
    piVar2 = co->fStore;
    iVar1 = piVar2[1];
    piVar2[1] = iVar1 + 1;
    if (1 << ((byte)iVar3 & 0x1f) <= iVar1 + *piVar2 + 1) {
      piVar2[1] = 1;
      *piVar2 = *piVar2 + 1;
      return;
    }
  }
  return;
}

Assistant:

void TPZGraphElT::NextIJ(int no, TPZVec<int> &co, int incr){
	int res = fGraphMesh->Res();
	int imax;
	imax = 1 << res;
	switch(no) {
		case 0:
		case 1:
		case 2:
			return;
		case 3:
			co[0] += incr;
			break;
		case 4:
			co[0] += incr;
			co[1] -= incr;
			break;
		case 5:
			co[1]+= incr;
			break;
		case 6:
			co[1]++;
			if(co[0]+co[1]>= imax) {
				co[1] = 1;
				co[0]++;
			}
			break;
	}
}